

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O1

void __thiscall cab::add_request(cab *this,node_type src,node_type dst,uint32_t passengers)

{
  vector<request,_std::allocator<request>_> *this_00;
  pointer *pprVar1;
  int iVar2;
  node_type *pnVar3;
  node_type *pnVar4;
  road_network *prVar5;
  iterator __position;
  cab_session *this_01;
  bool bVar6;
  byte bVar7;
  node_type nVar8;
  bool bVar9;
  node_type nVar10;
  bool bVar11;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  node_type *pnVar15;
  pointer prVar16;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  long lVar18;
  bool bVar19;
  uint local_5c;
  request local_40;
  
  this_00 = &this->_requests;
  prVar16 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar19 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_finish != prVar16;
  if (bVar19) {
    lVar18 = 0;
    uVar17 = 0;
    do {
      nVar8 = request::src((request *)(&prVar16->_src + lVar18));
      if ((nVar8 == src) &&
         (nVar8 = request::dst((request *)
                               (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->_src + lVar18)),
         nVar8 == dst)) {
        request::add_passengers
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar18),passengers);
        if (bVar19) {
          return;
        }
        break;
      }
      uVar17 = uVar17 + 1;
      prVar16 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x10;
      bVar19 = uVar17 < (ulong)((long)(this->_requests).
                                      super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)prVar16 >> 4);
    } while (bVar19);
  }
  pnVar3 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pnVar4 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_5c = 0;
  if (pnVar3 == pnVar4) {
    bVar19 = false;
    bVar6 = false;
  }
  else {
    bVar19 = false;
    bVar7 = 0;
    bVar6 = false;
    do {
      pnVar15 = pnVar3 + 1;
      nVar8 = *pnVar3;
      bVar19 = (bool)(nVar8 == src | bVar19);
      bVar7 = nVar8 == src | bVar7;
      bVar6 = (bool)(nVar8 == dst & bVar7 | bVar6);
      if ((bool)(bVar7 & bVar6)) break;
      pnVar3 = pnVar15;
    } while (pnVar15 != pnVar4);
  }
  if ((this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar18 = 0;
    local_5c = 0;
    uVar17 = 0;
    do {
      bVar9 = road_network::is_inner(this->_rnet,src);
      if (!bVar19) {
        prVar5 = this->_rnet;
        nVar8 = this->_position;
        nVar10 = request::src((request *)
                              (&((this->_requests).
                                 super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_src + lVar18));
        bVar11 = road_network::in_between(prVar5,nVar8,nVar10,src);
        if (!bVar11) {
          prVar5 = this->_rnet;
          nVar8 = request::src((request *)
                               (&((this->_requests).
                                  super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                  super__Vector_impl_data._M_start)->_src + lVar18));
          nVar10 = request::dst((request *)
                                (&((this->_requests).
                                   super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_src + lVar18));
          bVar11 = road_network::in_between(prVar5,nVar8,nVar10,src);
          if (!bVar11) goto LAB_0016827e;
        }
        request::add_detours
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar18),2 - bVar9);
      }
LAB_0016827e:
      bVar9 = road_network::is_inner(this->_rnet,dst);
      if (!bVar6) {
        prVar5 = this->_rnet;
        nVar8 = this->_position;
        nVar10 = request::src((request *)
                              (&((this->_requests).
                                 super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_src + lVar18));
        bVar11 = road_network::in_between(prVar5,nVar8,nVar10,dst);
        if (!bVar11) {
          prVar5 = this->_rnet;
          nVar8 = request::src((request *)
                               (&((this->_requests).
                                  super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                  super__Vector_impl_data._M_start)->_src + lVar18));
          nVar10 = request::dst((request *)
                                (&((this->_requests).
                                   super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_src + lVar18));
          bVar11 = road_network::in_between(prVar5,nVar8,nVar10,dst);
          if (!bVar11) goto LAB_00168311;
        }
        request::add_detours
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar18),2 - bVar9);
      }
LAB_00168311:
      uVar12 = request::detours((request *)
                                (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->_src + lVar18));
      if (local_5c < uVar12) {
        local_5c = request::detours((request *)
                                    (&((this_00->
                                       super__Vector_base<request,_std::allocator<request>_>).
                                       _M_impl.super__Vector_impl_data._M_start)->_src + lVar18));
      }
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar17 < (ulong)((long)(this->_requests).
                                    super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this->_requests).
                                    super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 4));
  }
  uVar13 = this->_costs;
  if (this->_costs < local_5c) {
    uVar13 = local_5c;
  }
  this->_costs = uVar13;
  request::request(&local_40,src,dst,passengers);
  __position._M_current =
       (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<request,_std::allocator<request>_>::_M_realloc_insert<request>
              (this_00,__position,&local_40);
  }
  else {
    (__position._M_current)->_src = local_40._src;
    (__position._M_current)->_dst = local_40._dst;
    *(undefined2 *)&(__position._M_current)->field_0x2 = local_40._2_2_;
    (__position._M_current)->_passengers = local_40._passengers;
    (__position._M_current)->_detours = local_40._detours;
    (__position._M_current)->_picked_up = local_40._picked_up;
    *(undefined3 *)&(__position._M_current)->field_0xd = local_40._13_3_;
    pprVar1 = &(this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  this_02 = (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar14 = this_02->_M_use_count;
    do {
      if (iVar14 == 0) {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_02->_M_use_count;
      bVar19 = iVar14 == iVar2;
      if (bVar19) {
        this_02->_M_use_count = iVar14 + 1;
        iVar2 = iVar14;
      }
      iVar14 = iVar2;
      UNLOCK();
    } while (!bVar19);
  }
  if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar19 = true;
  }
  else {
    bVar19 = this_02->_M_use_count == 0;
  }
  this_01 = (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_01 == (cab_session *)0x0 | bVar19)) {
    cab_session::send_request
              (this_01,(this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return;
}

Assistant:

void cab::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == src && _requests[i].dst() == dst)
        {
            _requests[i].add_passengers(passengers);
            return;
        }
    }

    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    // add detours to all requests
    // does the sme as calculate costs
    std::uint32_t max = 0;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        bool is_inner = _rnet->is_inner(src); 
        if(!found_src && (_rnet->in_between(_position, _requests[i].src(), src) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), src)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }

        is_inner = _rnet->is_inner(dst); 
        if(!found_dst && (_rnet->in_between(_position, _requests[i].src(), dst) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), dst)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }
        
        max = _requests[i].detours() > max ? _requests[i].detours() : max;
    }
    _costs = max > _costs ? max : _costs; 

    _requests.push_back(request(src, dst, passengers));

    // inform external controller
    if(auto shared = _cab_session.lock())
    {
        shared->send_request(_requests.back());
    }
}